

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_LBackward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  complex<double> *pcVar1;
  int64_t iVar2;
  long lVar3;
  complex<double> **ppcVar4;
  complex<double> *pcVar5;
  TPZBaseMatrix *in_RSI;
  complex<double> *in_RDI;
  int64_t extraout_XMM0_Qa;
  int64_t in_XMM1_Qa;
  complex<double> val;
  complex<double> *BPtr;
  complex<double> *end_ki;
  complex<double> *elem_ki;
  int64_t j;
  int64_t k;
  int64_t Dimension;
  char *in_stack_00000188;
  char *in_stack_00000190;
  complex<double> *__x;
  int64_t in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffffb0;
  complex<double> *local_30;
  complex<double> *local_28;
  long local_20;
  
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*(long *)in_RDI->_M_value + 0x60))();
  if (((iVar2 != lVar3) || (in_RDI[1]._M_value[8] == '\0')) || (in_RDI[1]._M_value[8] == '\x03')) {
    TPZMatrix<std::complex<double>_>::Error(in_stack_00000190,in_stack_00000188);
  }
  local_20 = (**(code **)(*(long *)in_RDI->_M_value + 0x60))();
  while (lVar3 = local_20, local_20 = lVar3 + -1, 0 < local_20) {
    local_28 = (complex<double> *)0x0;
    while (__x = local_28, iVar2 = TPZBaseMatrix::Cols(in_RSI), (long)__x < iVar2) {
      ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 2),local_20);
      local_30 = *ppcVar4;
      ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 2),lVar3);
      pcVar1 = *ppcVar4;
      pcVar5 = TPZFMatrix<std::complex<double>_>::operator()
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffb0 = *(TPZFMatrix<std::complex<double>_> **)pcVar5->_M_value;
      while (local_30 = local_30 + 1, local_30 < pcVar1) {
        std::operator*(__x,(complex<double> *)0x137e4a5);
        in_stack_ffffffffffffffa0 = extraout_XMM0_Qa;
        in_stack_ffffffffffffffa8 = in_XMM1_Qa;
        std::complex<double>::operator-=(in_RDI,__x);
      }
      local_28 = (complex<double> *)(local_28->_M_value + 1);
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed || this->fDecomposed == ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
    
    int64_t Dimension = this->Dim();
    for ( int64_t k = Dimension-1; k > 0; k-- ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            //		TVar val = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            // substract the column of the skyline matrix from the vector.
            
            TVar val = *BPtr;
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    return( 1 );
}